

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entries.cpp
# Opt level: O2

Data * DL::Expressions::named_func(Data *__return_storage_ptr__,vector_t<Data> *args,VM *vm)

{
  pointer pDVar1;
  DataGroup *pDVar2;
  vector_t<Data> *pvVar3;
  Data *data;
  pointer data_00;
  DataGroup grp;
  Data d;
  allocator local_b1;
  string_t local_b0;
  DataGroup local_90;
  Data local_80;
  
  union_func(&local_80,args,vm);
  if (local_80.mType == DT_Group) {
    pDVar2 = Data::getGroup(&local_80);
    pvVar3 = DataGroup::getNamedEntries(pDVar2);
    if ((pvVar3->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
        super__Vector_impl_data._M_start !=
        (pvVar3->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)&local_b0,"",&local_b1);
      DataGroup::DataGroup(&local_90,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      pDVar2 = Data::getGroup(&local_80);
      pvVar3 = DataGroup::getNamedEntries(pDVar2);
      pDVar1 = (pvVar3->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (data_00 = (pvVar3->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                     super__Vector_impl_data._M_start; data_00 != pDVar1; data_00 = data_00 + 1) {
        DataGroup::add(&local_90,data_00);
      }
      std::__cxx11::string::string((string *)&local_b0,"",&local_b1);
      Data::Data(__return_storage_ptr__,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      Data::setGroup(__return_storage_ptr__,&local_90);
      DataGroup::~DataGroup(&local_90);
      goto LAB_0010fed3;
    }
    std::__cxx11::string::string((string *)&local_b0,"",(allocator *)&local_90);
    Data::Data(__return_storage_ptr__,&local_b0);
  }
  else {
    std::__cxx11::string::string((string *)&local_b0,"",(allocator *)&local_90);
    Data::Data(__return_storage_ptr__,&local_b0);
  }
  std::__cxx11::string::~string((string *)&local_b0);
LAB_0010fed3:
  Data::~Data(&local_80);
  return __return_storage_ptr__;
}

Assistant:

Data named_func(const vector_t<Data>& args, VM& vm)
{
	Data d = union_func(args, vm);

	if (d.type() != DT_Group)
		return Data();

	if (d.getGroup().getNamedEntries().empty())
		return Data();

	DataGroup grp;
	for (const Data& data : d.getGroup().getNamedEntries())
		grp.add(data);

	Data r;
	r.setGroup(grp);
	return r;
}